

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O0

_Bool find_requested_sub_protocol(cio_websocket_location_handler *handler,char *name,size_t length)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  size_t name_length;
  char *sub_protocol;
  uint i;
  size_t length_local;
  char *name_local;
  cio_websocket_location_handler *handler_local;
  
  sub_protocol._4_4_ = 0;
  while( true ) {
    if (handler->number_subprotocols <= (ulong)sub_protocol._4_4_) {
      return false;
    }
    __s = handler->subprotocols[sub_protocol._4_4_];
    sVar2 = strlen(__s);
    if ((sVar2 == length) && (iVar1 = memcmp(__s,name,length), iVar1 == 0)) break;
    sub_protocol._4_4_ = sub_protocol._4_4_ + 1;
  }
  handler->chosen_subprotocol = sub_protocol._4_4_;
  return true;
}

Assistant:

static bool find_requested_sub_protocol(struct cio_websocket_location_handler *handler, const char *name, size_t length)
{
	for (unsigned int i = 0; i < handler->number_subprotocols; i++) {
		const char *sub_protocol = handler->subprotocols[i];
		size_t name_length = strlen(sub_protocol);
		if ((name_length == length) && (memcmp(sub_protocol, name, length) == 0)) {
			handler->chosen_subprotocol = (signed int)i;
			return true;
		}
	}

	return false;
}